

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualify_binder.cpp
# Opt level: O2

void __thiscall
duckdb::QualifyBinder::QualifyBinder
          (QualifyBinder *this,Binder *binder,ClientContext *context,BoundSelectNode *node,
          BoundGroupInformation *info)

{
  LogicalType LStack_28;
  
  BaseSelectBinder::BaseSelectBinder(&this->super_BaseSelectBinder,binder,context,node,info);
  (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&PTR__QualifyBinder_0178b4e0;
  ColumnAliasBinder::ColumnAliasBinder(&this->column_alias_binder,&node->bind_state);
  LogicalType::LogicalType(&LStack_28,BOOLEAN);
  LogicalType::operator=
            (&(this->super_BaseSelectBinder).super_ExpressionBinder.target_type,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  return;
}

Assistant:

QualifyBinder::QualifyBinder(Binder &binder, ClientContext &context, BoundSelectNode &node, BoundGroupInformation &info)
    : BaseSelectBinder(binder, context, node, info), column_alias_binder(node.bind_state) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}